

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O1

int lua_gettable(lua_State *L,int idx)

{
  long lVar1;
  TValue *t;
  TValue *slot;
  TValue *io1;
  bool bVar2;
  
  t = index2value(L,idx);
  if (t->tt_ == 'E') {
    slot = luaH_get((Table *)(t->value_).gc,(TValue *)((L->top).offset + -0x10));
    bVar2 = (slot->tt_ & 0xf) == 0;
  }
  else {
    bVar2 = true;
    slot = (TValue *)0x0;
  }
  lVar1 = (L->top).offset;
  if (bVar2) {
    luaV_finishget(L,t,(TValue *)(lVar1 + -0x10),(StkId)(lVar1 + -0x10),slot);
  }
  else {
    *(Value *)(lVar1 + -0x10) = slot->value_;
    *(lu_byte *)(lVar1 + -8) = slot->tt_;
  }
  return *(byte *)((L->top).offset + -8) & 0xf;
}

Assistant:

LUA_API int lua_gettable (lua_State *L, int idx) {
  const TValue *slot;
  TValue *t;
  lua_lock(L);
  t = index2value(L, idx);
  if (luaV_fastget(L, t, s2v(L->top.p - 1), slot, luaH_get)) {
    setobj2s(L, L->top.p - 1, slot);
  }
  else
    luaV_finishget(L, t, s2v(L->top.p - 1), L->top.p - 1, slot);
  lua_unlock(L);
  return ttype(s2v(L->top.p - 1));
}